

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::connect_failed(peer_connection *this,error_code *e)

{
  session_interface *psVar1;
  io_context *ctx;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  bt_peer_connection *this_00;
  undefined4 extraout_var_00;
  endpoint *ep;
  endpoint *ep_00;
  undefined1 auVar7 [16];
  bt_peer_connection *p;
  type local_f0;
  enable_shared_from_this<libtorrent::aux::peer_connection> local_d0;
  undefined1 local_c0 [8];
  weak_ptr<libtorrent::aux::peer_connection> weak_self;
  weak_ptr<libtorrent::aux::torrent> weak_t;
  undefined1 local_98 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  string local_58;
  string local_38;
  error_code *local_18;
  error_code *e_local;
  peer_connection *this_local;
  
  local_18 = e;
  e_local = (error_code *)this;
  bVar2 = should_log(this,info);
  if (bVar2) {
    print_endpoint_abi_cxx11_(&local_38,(aux *)&this->m_remote,ep);
    auVar7 = ::std::__cxx11::string::c_str();
    print_error_abi_cxx11_(&local_58,(libtorrent *)local_18,auVar7._8_8_);
    uVar5 = ::std::__cxx11::string::c_str();
    peer_log(this,info,"CONNECTION FAILED","%s %s",auVar7._0_8_,uVar5);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  uVar3 = (**(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger)();
  if ((uVar3 & 1) != 0) {
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    print_endpoint_abi_cxx11_
              ((string *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(aux *)&this->m_remote,ep_00);
    uVar5 = ::std::__cxx11::string::c_str();
    (*(psVar1->super_session_logger)._vptr_session_logger[1])(psVar1,"CONNECTION FAILED: %s",uVar5);
    ::std::__cxx11::string::~string
              ((string *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  counters::inc_stats_counter(this->m_counters,0x2b,1);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_98);
  if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 1 & 1) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
    if ((bVar2) && (this->m_peer_info != (torrent_peer *)0x0)) {
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_98);
      torrent::dec_num_connecting(peVar6,this->m_peer_info);
    }
    (this->super_peer_connection_hot_members).field_0x28 =
         (this->super_peer_connection_hot_members).field_0x28 & 0xfd;
  }
  bVar2 = is_utp(&this->m_socket);
  if ((((bVar2) && (this->m_peer_info != (torrent_peer *)0x0)) &&
      ((*(uint *)&this->m_peer_info->field_0x1b >> 0x1c & 1) != 0)) &&
     ((*(ushort *)&this->field_0x885 >> 0xe & 1) == 0)) {
    *(uint *)&this->m_peer_info->field_0x1b = *(uint *)&this->m_peer_info->field_0x1b & 0xefffffff;
    fast_reconnect(this,true);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_18,0x10,0);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
    if ((bVar2) && (this->m_peer_info != (torrent_peer *)0x0)) {
      ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
                ((weak_ptr<libtorrent::aux::torrent> *)
                 &weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<libtorrent::aux::torrent> *)local_98);
      ::std::enable_shared_from_this<libtorrent::aux::peer_connection>::shared_from_this(&local_d0);
      ::std::weak_ptr<libtorrent::aux::peer_connection>::
      weak_ptr<libtorrent::aux::peer_connection,void>
                ((weak_ptr<libtorrent::aux::peer_connection> *)local_c0,
                 (shared_ptr<libtorrent::aux::peer_connection> *)&local_d0);
      ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
                ((shared_ptr<libtorrent::aux::peer_connection> *)&local_d0);
      ctx = this->m_ios;
      ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr
                (&local_f0.weak_t,
                 (weak_ptr<libtorrent::aux::torrent> *)
                 &weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::weak_ptr<libtorrent::aux::peer_connection>::weak_ptr
                (&local_f0.weak_self,(weak_ptr<libtorrent::aux::peer_connection> *)local_c0);
      boost::asio::
      post<boost::asio::io_context,libtorrent::aux::peer_connection::connect_failed(boost::system::error_code_const&)::__0>
                (ctx,&local_f0,(type *)0x0);
      connect_failed(boost::system::error_code_const&)::$_0::~__0((__0 *)&local_f0);
      ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr
                ((weak_ptr<libtorrent::aux::peer_connection> *)local_c0);
      ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                ((weak_ptr<libtorrent::aux::torrent> *)
                 &weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    if ((*(ushort *)&this->field_0x885 >> 0xe & 1) != 0) {
      fast_reconnect(this,true);
    }
    bVar2 = is_utp(&this->m_socket);
    if (((!bVar2) ||
        (bVar2 = session_settings::get_bool
                           ((this->super_peer_connection_hot_members).m_settings,0x8022), !bVar2))
       && ((this->m_peer_info != (torrent_peer *)0x0 &&
           (((*(uint *)&this->m_peer_info->field_0x1b >> 0x1e & 1) != 0 &&
            ((*(ushort *)&this->field_0x885 >> 0xe & 1) == 0)))))) {
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_98);
      iVar4 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      this_00 = torrent::find_introducer(peVar6,(endpoint *)CONCAT44(extraout_var,iVar4));
      if (this_00 != (bt_peer_connection *)0x0) {
        iVar4 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
        bt_peer_connection::write_holepunch_msg
                  (this_00,rendezvous,(endpoint *)CONCAT44(extraout_var_00,iVar4),no_error);
      }
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_18,0x10,1);
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_98);
  return;
}

Assistant:

void peer_connection::connect_failed(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "CONNECTION FAILED"
				, "%s %s", print_endpoint(m_remote).c_str(), print_error(e).c_str());
		}
#endif
#ifndef TORRENT_DISABLE_LOGGING
		if (m_ses.should_log())
			m_ses.session_log("CONNECTION FAILED: %s", print_endpoint(m_remote).c_str());
#endif

		m_counters.inc_stats_counter(counters::connect_timeouts);

		auto t = m_torrent.lock();
		TORRENT_ASSERT(!m_connecting || t);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t && m_peer_info) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		// a connection attempt using uTP just failed
		// mark this peer as not supporting uTP
		// we'll never try it again (unless we're trying holepunch)
		if (is_utp(m_socket)
			&& m_peer_info
			&& m_peer_info->supports_utp
			&& !m_holepunch_mode)
		{
			m_peer_info->supports_utp = false;
			// reconnect immediately using TCP
			fast_reconnect(true);
			disconnect(e, operation_t::connect, normal);
			if (t && m_peer_info)
			{
				std::weak_ptr<aux::torrent> weak_t = t;
				std::weak_ptr<peer_connection> weak_self = shared_from_this();

				// we can't touch m_connections here, since we're likely looping
				// over it. So defer the actual reconnection to after we've handled
				// the existing message queue
				post(m_ios, [weak_t, weak_self]()
				{
					auto tor = weak_t.lock();
					std::shared_ptr<peer_connection> p = weak_self.lock();
					if (tor && p)
					{
						aux::torrent_peer* pi = p->peer_info_struct();
						tor->connect_to_peer(pi, true);
					}
				});
			}
			return;
		}

		if (m_holepunch_mode)
			fast_reconnect(true);

#ifndef TORRENT_DISABLE_EXTENSIONS
		if ((!is_utp(m_socket)
				|| !m_settings.get_bool(settings_pack::enable_outgoing_tcp))
			&& m_peer_info
			&& m_peer_info->supports_holepunch
			&& !m_holepunch_mode)
		{
			// see if we can try a holepunch
			aux::bt_peer_connection* p = t->find_introducer(remote());
			if (p)
				p->write_holepunch_msg(aux::bt_peer_connection::hp_message::rendezvous, remote());
		}
#endif

		disconnect(e, operation_t::connect, failure);
	}